

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoProvider.cpp
# Opt level: O0

void InfoProvider::initProcessList(void)

{
  QString local_c8;
  QString local_b0;
  QString local_88;
  QString local_70;
  QString local_58;
  QString local_40;
  undefined1 local_28 [8];
  QString processListPattern;
  anon_class_1_0_00000001 repeatString;
  
  processListPattern.d.size._7_1_ = 0;
  QString::QString(&local_88,"[ \\t]*([0-9]+)");
  initProcessList::anon_class_1_0_00000001::operator()
            (&local_70,(anon_class_1_0_00000001 *)((long)&processListPattern.d.size + 7),&local_88,2
            );
  operator+(&local_58,&local_70,"[ \\t]*(C(?:\\+G)?|G)");
  QString::QString(&local_c8,"[ \\t]*([0-9\\-]+)");
  initProcessList::anon_class_1_0_00000001::operator()
            (&local_b0,(anon_class_1_0_00000001 *)((long)&processListPattern.d.size + 7),&local_c8,8
            );
  operator+(&local_40,&local_58,&local_b0);
  operator+((QString *)local_28,&local_40,"[ \\t]*([^ \\t\\n]+)");
  QString::~QString(&local_40);
  QString::~QString(&local_b0);
  QString::~QString(&local_c8);
  QString::~QString(&local_58);
  QString::~QString(&local_70);
  QString::~QString(&local_88);
  QRegularExpression::setPattern((QString *)&m_processListRegex);
  QString::~QString((QString *)local_28);
  return;
}

Assistant:

void InfoProvider::initProcessList() {
    // TODO: maybe to keep compatibility with older (and newer) drivers, firstly find indices,
    //  like in `initGPUInfo`, instead of hard-coded ones?

    /* Process list example:

        # gpu         pid   type     sm    mem    enc    dec    jpg    ofa     fb   ccpm    command
        # Idx           #    C/G      %      %      %      %      %      %     MB     MB    name
            0       2479     G      -      -      -      -      -      -      1      0    kwalletd6
            0       2481     G      -      -      -      -      -      -    624      0    Xorg

      * Parse pattern:
      *     n           n    C/G     n/-    n/-    n/-    n/-    n/-    n/-    n/-    n/-   process name
      */

    auto repeatString = [](const QString &str, int times) {
        QString result;

        for (int i = 0; i < times; i++)
            result += str;

        return result;
    };

#define spacer R"([ \t]*)"

    const QString processListPattern{
        repeatString(spacer "([0-9]+)", 2) + // gpu id, pid
        spacer R"((C(?:\+G)?|G))" + // type
        repeatString(spacer R"(([0-9\-]+))", 8) + // sm, mem, enc, dec, jpg, ofa, fb, ccpm
        spacer R"(([^ \t\n]+))" // process name
    };

    m_processListRegex.setPattern(processListPattern);
}